

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::GetS2
          (NESTcalc *this,int Ne,double truthPosX,double truthPosY,double truthPosZ,double smearPosX
          ,double smearPosY,double smearPosZ,double dt,double driftVelocity,uint64_t evtNum,
          double dfield,S2CalculationMode mode,int outputTiming,
          vector<long,_std::allocator<long>_> *wf_time,
          vector<double,_std::allocator<double>_> *wf_amp,
          vector<double,_std::allocator<double>_> *g2_params)

{
  double *pdVar1;
  pointer pdVar2;
  double dVar3;
  bool bVar4;
  undefined4 uVar5;
  RandomGen *pRVar6;
  int64_t iVar7;
  int64_t iVar8;
  RandomGen *this_00;
  vector<double,_std::allocator<double>_> *pvVar9;
  ostream *poVar10;
  VDetector *pVVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  size_type __new_size;
  int iVar16;
  ulong uVar17;
  size_type sVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  pointer pdVar23;
  ulong uVar24;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 local_318 [16];
  double local_2f8;
  byte local_2c8;
  bool YesGas;
  double local_2c0;
  double local_2b8;
  double dt_local;
  long local_2a8;
  double local_2a0;
  double local_298;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  long local_260;
  ulong local_258;
  int local_24c;
  vector<double,_std::allocator<double>_> AreaTableBot [2];
  vector<double,_std::allocator<double>_> electronstream;
  double local_1e8;
  vector<double,_std::allocator<double>_> AreaTableTop [2];
  double phe;
  vector<double,_std::allocator<double>_> TimeTable;
  photonstream photon_times;
  double local_128;
  double local_118;
  double offset;
  photonstream photon_emission_times;
  _Vector_base<double,_std::allocator<double>_> local_60;
  double local_48;
  undefined8 uStack_40;
  
  pdVar1 = (g2_params->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar34 = *pdVar1;
  dVar33 = pdVar1[1];
  dVar31 = pdVar1[2];
  dVar3 = pdVar1[3];
  local_270 = pdVar1[4];
  pdVar2 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar23 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar23 != pdVar2; pdVar23 = pdVar23 + 1) {
    *pdVar23 = 0.0;
  }
  if (mode == WaveformWithEtrain) {
    pdVar23 = (pointer)(CONCAT71((int7)((ulong)this->fdetector >> 8),this->fdetector->inGas) ^ 1);
    local_2c8 = (byte)pdVar23;
  }
  else {
    local_2c8 = 0;
  }
  local_318._0_8_ = 1.0;
  if (((1.0 <= dfield) &&
      (auVar35._4_4_ = -(uint)(dVar33 <= 0.0), auVar35._0_4_ = -(uint)(dVar34 <= 0.0),
      auVar35._8_4_ = -(uint)(dVar31 <= 0.0), auVar35._12_4_ = -(uint)(dVar3 <= 0.0),
      uVar5 = movmskps((int)pdVar23,auVar35), (char)uVar5 == '\0')) && (0.0 < local_270)) {
    local_128 = 0.0;
    dVar31 = smearPosX;
    local_2c0 = truthPosX;
    local_2b8 = truthPosY;
    dt_local = dt;
    local_268 = truthPosZ;
    local_24c = outputTiming;
    (*this->fdetector->_vptr_VDetector[6])(truthPosX,truthPosY,this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])(smearPosX,smearPosY,this->fdetector,1);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,1);
    local_298 = extraout_XMM0_Qa_02;
    bVar4 = ValidityTests::nearlyEqual(this->fdetector->g1_gas,1.0,1e-09);
    dVar25 = 1.0;
    if (!bVar4) {
      dVar25 = extraout_XMM0_Qa / extraout_XMM0_Qa_01;
      local_318._0_8_ = extraout_XMM0_Qa_00 / local_298;
    }
    bVar4 = ValidityTests::nearlyEqual(this->fdetector->g1_gas,0.0,1e-09);
    local_118 = 0.0;
    if (!bVar4) {
      local_128 = (double)local_318._0_8_;
      local_118 = dVar25;
    }
    pRVar6 = RandomGen::rndm();
    dVar25 = exp(-dt / this->fdetector->eLife_us);
    iVar7 = RandomGen::binom_draw(pRVar6,(long)Ne,dVar25 * dVar33);
    uVar13 = (uint)iVar7;
    dVar25 = (double)(int)uVar13;
    if (mode - Waveform < 2) {
      electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar20 = uVar13;
      if (local_2c8 != 0) {
        pRVar6 = RandomGen::rndm();
        dVar26 = exp(-dt_local / this->fdetector->eLife_us);
        iVar7 = RandomGen::binom_draw(pRVar6,(long)Ne,dVar26);
        uVar20 = (uint)iVar7;
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&electronstream,(long)(int)uVar20,&dt_local);
      dVar27 = pow(dfield,0.093452);
      dVar26 = exp(dfield * -8.1651e-05);
      dVar26 = dVar26 * dVar27 * 37.368;
      local_298 = pow(dfield,-0.24855);
      local_2a0 = exp(dfield / -35.661);
      dVar27 = this->fdetector->E_gas * 1000.0;
      dVar28 = pow(dVar27,3.0);
      dVar29 = dVar26 * 0.01;
      if (this->fdetector->inGas == true) {
        dVar26 = pow(dfield,3.0);
        auVar39._8_8_ = dVar26;
        auVar39._0_8_ = dfield * dfield;
        auVar35 = divpd(_DAT_00116a60,auVar39);
        dVar30 = auVar35._8_8_ + ((19097.0 / dfield + 4.265) - auVar35._0_8_);
        dVar26 = dVar29;
      }
      else {
        dVar30 = local_298 * 66.35 + local_2a0 * 36.85;
      }
      local_278 = (dVar30 + dVar30) * dt_local * 1e-06;
      if (local_278 < 0.0) {
        local_278 = sqrt(local_278);
      }
      else {
        local_278 = SQRT(local_278);
      }
      local_280 = (dVar26 + dVar26) * dt_local * 1e-06;
      if (local_280 < 0.0) {
        local_280 = sqrt(local_280);
      }
      else {
        local_280 = SQRT(local_280);
      }
      YesGas = true;
      pVVar11 = this->fdetector;
      dVar26 = GetDensity(pVVar11->T_Kelvin,pVVar11->p_bar,&YesGas,1,pVVar11->molarMass);
      local_2a0 = GetDriftVelocity_MagBoltz
                            (dVar26,dVar26,this->fdetector->E_gas * 1000.0,dVar31,
                             this->fdetector->molarMass);
      dVar26 = 124770000.0 / dVar28 + 19097.0 / dVar27 + 4.265 + -1739700.0 / (dVar27 * dVar27);
      dVar31 = local_270 / local_2a0;
      local_288 = (dVar26 + dVar26) * dVar31 * 1e-06;
      if (local_288 < 0.0) {
        local_288 = sqrt(local_288);
      }
      else {
        local_288 = SQRT(local_288);
      }
      dVar31 = (dVar29 + dVar29) * dVar31 * 1e-06;
      if (dVar31 < 0.0) {
        dVar31 = sqrt(dVar31);
      }
      else {
        dVar31 = SQRT(dVar31);
      }
      local_278 = local_278 * 10.0;
      local_280 = local_280 * 10.0;
      local_288 = local_288 * 10.0;
      local_48 = -(5303.0 / (dfield * dfield) + 0.28326);
      uStack_40 = 0x8000000000000000;
      dVar27 = local_2a0 * 4.5545e-31 * local_2a0;
      dVar26 = local_270 * 0.5;
      uVar15 = 0;
      uVar14 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar14 = uVar15;
      }
      local_2f8 = 1e+100;
      local_2a8 = 0;
      local_260 = 0;
      local_258 = 0;
      local_1e8 = 0.0;
      for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
        pRVar6 = RandomGen::rndm();
        dVar28 = RandomGen::rand_gauss(pRVar6,0.0,local_278,false);
        pRVar6 = RandomGen::rndm();
        local_318._0_8_ = RandomGen::rand_gauss(pRVar6,0.0,local_280,false);
        pRVar6 = RandomGen::rndm();
        dVar29 = RandomGen::rand_uniform(pRVar6);
        local_318._0_8_ = ABS((double)local_318._0_8_);
        dVar30 = cos(dVar29 * 6.283185307179586);
        dVar29 = sin(dVar29 * 6.283185307179586);
        dVar30 = dVar30 * (double)local_318._0_8_ + local_2c0;
        dVar29 = dVar29 * (double)local_318._0_8_ + local_2b8;
        pVVar11 = this->fdetector;
        if (dVar30 * dVar30 + dVar29 * dVar29 <= pVVar11->radmax * pVVar11->radmax) {
          dVar28 = dVar28 / driftVelocity + 0.0;
          if ((pVVar11->inGas == false) && ((pVVar11->E_gas != 0.0 || (NAN(pVVar11->E_gas))))) {
            pRVar6 = RandomGen::rndm();
            dVar32 = RandomGen::rand_uniform(pRVar6);
            dVar32 = log(dVar32);
            dVar28 = dVar28 + dVar32 * local_48;
          }
          electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] =
               dVar28 + electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15];
          pRVar6 = RandomGen::rndm();
          dVar28 = this->fdetector->s2Fano * dVar34;
          if (dVar28 < 0.0) {
            dVar28 = sqrt(dVar28);
          }
          else {
            dVar28 = SQRT(dVar28);
          }
          dVar28 = RandomGen::rand_gauss(pRVar6,dVar34,dVar28,true);
          dVar28 = floor(dVar28 + 0.5);
          pRVar6 = RandomGen::rndm();
          uVar17 = (long)(dVar28 - 9.223372036854776e+18) & (long)dVar28 >> 0x3f | (long)dVar28;
          iVar7 = RandomGen::binom_draw(pRVar6,uVar17,this->fdetector->g1_gas * local_118);
          local_298 = (double)iVar7;
          dVar38 = local_298 - 9.223372036854776e+18;
          dVar28 = this->fdetector->TopDrift;
          dVar32 = floor(local_298 * 0.0566 + 0.5);
          GetPhotonTimes(&photon_emission_times,this,beta,(int)iVar7,(int)dVar32,dfield,
                         (dVar27 * 1000000.0) / 1.602e-16);
          AddPhotonTransportTime
                    (&photon_times,this,&photon_emission_times,dVar30,dVar29,dVar28 + dVar26);
          pRVar6 = RandomGen::rndm();
          uVar24 = (long)dVar38 & (long)local_298 >> 0x3f | (long)local_298;
          iVar7 = RandomGen::binom_draw(pRVar6,uVar24,this->fdetector->P_dphe);
          local_298 = local_298 + (double)iVar7;
          dVar30 = local_298 - 9.223372036854776e+18;
          pRVar6 = RandomGen::rndm();
          dVar28 = RandomGen::rand_gauss(pRVar6,0.0,local_288,false);
          pRVar6 = RandomGen::rndm();
          RandomGen::rand_gauss(pRVar6,0.0,dVar31 * 10.0,false);
          pRVar6 = RandomGen::rndm();
          dVar29 = RandomGen::rand_uniform(pRVar6);
          cos(dVar29 * 6.283185307179586);
          sin(dVar29 * 6.283185307179586);
          electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] =
               dVar28 / local_2a0 +
               electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15];
          bVar19 = (long)(int)uVar13 <= (long)uVar15 & local_2c8;
          if (bVar19 == 1) {
            dVar28 = this->fdetector->TopDrift;
            dVar32 = this->fdetector->E_gas / 1.8476719333639615;
            dVar29 = exp(dVar32 * 0.15578);
            dVar32 = exp(dVar32 * 0.21177);
            pRVar6 = RandomGen::rndm();
            dVar38 = RandomGen::rand_uniform(pRVar6);
            if (((dVar32 * 0.38157 * 0.01) / 0.035) * dVar33 <= dVar38) {
              pRVar6 = RandomGen::rndm();
              dVar28 = RandomGen::rand_uniform(pRVar6);
              dVar28 = log(dVar28);
              electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] =
                   dVar29 * 1.4054 * 1000.0 * -0.01 * dVar28 +
                   electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15];
            }
            else {
              pRVar6 = RandomGen::rndm();
              dVar29 = RandomGen::rand_uniform(pRVar6);
              dVar29 = (dVar28 / driftVelocity) / dVar29;
              dVar28 = 1000000.0;
              if (dVar29 <= 1000000.0) {
                dVar28 = dVar29;
              }
              electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] =
                   dVar28 + electronstream.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15];
            }
          }
          local_258 = local_258 + uVar17;
          local_260 = local_260 + uVar24;
          local_2a8 = local_2a8 + ((long)dVar30 & (long)local_298 >> 0x3f | (long)local_298);
          for (dVar28 = 0.0; dVar28 < local_298; dVar28 = dVar28 + 1.0) {
            pRVar6 = RandomGen::rndm();
            this_00 = RandomGen::rndm();
            dVar29 = RandomGen::FindNewMean(this_00,this->fdetector->sPEres);
            phe = RandomGen::rand_zero_trunc_gauss(pRVar6,1.0 / dVar29,this->fdetector->sPEres);
            if (bVar19 == 0) {
              local_1e8 = local_1e8 + phe;
            }
            dVar29 = this->fdetector->TopDrift;
            pRVar6 = RandomGen::rndm();
            dVar30 = RandomGen::rand_uniform(pRVar6);
            uVar12 = (long)(dVar28 - 9.223372036854776e+18) & (long)dVar28 >> 0x3f | (long)dVar28;
            uVar24 = (long)photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
            uVar17 = 0;
            if (uVar24 <= uVar12) {
              uVar17 = uVar24;
            }
            dVar30 = ((this->fdetector->anode - (dVar30 * local_270 + dVar29)) / local_2a0 +
                     electronstream.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15]) * 1000.0 +
                     photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12 - uVar17];
            offset = dVar30;
            pRVar6 = RandomGen::rndm();
            dVar32 = RandomGen::rand_uniform(pRVar6);
            (*this->fdetector->_vptr_VDetector[7])(local_2c0,local_2b8,SUB84(local_268,0),&local_60)
            ;
            dVar29 = local_60._M_impl.super__Vector_impl_data._M_start[1];
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
            if (dVar29 <= dVar32) {
              local_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (AreaTableBot,(double *)&local_60);
              std::vector<double,std::allocator<double>>::emplace_back<double&>
                        ((vector<double,std::allocator<double>> *)AreaTableTop,&phe);
            }
            else {
              std::vector<double,std::allocator<double>>::emplace_back<double&>
                        ((vector<double,std::allocator<double>> *)AreaTableBot,&phe);
              local_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (AreaTableTop,(double *)&local_60);
            }
            std::vector<double,std::allocator<double>>::emplace_back<double&>
                      ((vector<double,std::allocator<double>> *)&TimeTable,&offset);
            if (local_2f8 <= dVar30) {
              dVar30 = local_2f8;
            }
            local_2f8 = dVar30;
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&photon_times.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&photon_emission_times.super__Vector_base<double,_std::allocator<double>_>);
        }
      }
      __new_size = 100;
      if (100 < (int)local_2a8 * 1000) {
        __new_size = (size_type)(uint)((int)local_2a8 * 1000);
      }
      photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (AreaTableBot + 1,__new_size,(value_type *)&photon_emission_times);
      photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (AreaTableTop + 1,__new_size,(value_type *)&photon_emission_times);
      uVar13 = (int)__new_size - 1;
      lVar22 = 0;
      while( true ) {
        if (lVar22 == local_2a8) break;
        photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar4 = ValidityTests::nearlyEqual
                          (AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar22],0.0,1e-09);
        if (bVar4) {
          (*this->fdetector->_vptr_VDetector[9])
                    (AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22],
                     &photon_times.super__Vector_base<double,_std::allocator<double>_>);
        }
        else {
          (*this->fdetector->_vptr_VDetector[9])
                    (AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22],
                     &photon_times.super__Vector_base<double,_std::allocator<double>_>);
        }
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&photon_emission_times,
                   &photon_times.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&photon_times.super__Vector_base<double,_std::allocator<double>_>);
        iVar21 = 0;
        for (iVar16 = 0;
            iVar16 < (int)((ulong)((long)photon_emission_times.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)photon_emission_times.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3) + -1;
            iVar16 = iVar16 + 1) {
          dVar34 = *photon_emission_times.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          bVar4 = ValidityTests::nearlyEqual
                            (AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar22],0.0,1e-09);
          dVar33 = floor((dVar34 + (double)iVar21) / 10.0 + 0.5);
          uVar20 = (uint)dVar33;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          if ((int)uVar13 <= (int)uVar20) {
            uVar20 = uVar13;
          }
          dVar34 = ((dVar34 + (double)iVar21) -
                   TimeTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22]) + local_2f8 + -50.0;
          pvVar9 = AreaTableBot;
          if (bVar4) {
            pvVar9 = AreaTableTop;
          }
          dVar33 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
          pvVar9 = AreaTableBot;
          if (bVar4) {
            pvVar9 = AreaTableTop;
          }
          dVar34 = exp((dVar34 * dVar34) / -200.0);
          pdVar23 = pvVar9[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar23[uVar20] = dVar34 * ((dVar33 * 10.0) / 25.06628274631001) + pdVar23[uVar20];
          iVar21 = iVar21 + 10;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&photon_emission_times.super__Vector_base<double,_std::allocator<double>_>);
        lVar22 = lVar22 + 1;
      }
      pdVar23 = (pointer)(long)(local_2f8 + -50.0 + 5.0);
      local_318 = ZEXT816(0);
      local_2f8 = 0.0;
      for (sVar18 = 0; __new_size != sVar18; sVar18 = sVar18 + 1) {
        if (0.005 < AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar18] +
                    AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar18]) {
          photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = pdVar23;
          std::vector<long,_std::allocator<long>_>::emplace_back<unsigned_long>
                    (wf_time,(unsigned_long *)&photon_emission_times);
          photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[sVar18] +
                        AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar18]);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (wf_amp,(double *)&photon_emission_times);
          if (-1 < local_24c) {
            dVar34 = AreaTableBot[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar18];
            local_2f8 = (double)(-(ulong)(140.0 < dVar34) & (ulong)(dVar34 + -140.0));
            dVar33 = AreaTableTop[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar18];
            local_318._0_8_ = -(ulong)(140.0 < dVar33) & (ulong)(dVar33 + -140.0);
            local_318._8_8_ = 0;
            snprintf((char *)&photon_emission_times,0x50,"%llu\t%lld\t%.3f\t%.3f",dVar34 - local_2f8
                     ,dVar33 - (double)local_318._0_8_,evtNum,
                     *(undefined8 *)(*(long *)(wf_time + 8) + -8));
            poVar10 = std::operator<<((ostream *)&this->pulseFile,(char *)&photon_emission_times);
            std::endl<char,std::char_traits<char>>(poVar10);
          }
        }
        pdVar23 = (pointer)((long)pdVar23 + 10);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&TimeTable.super__Vector_base<double,_std::allocator<double>_>);
      lVar22 = 0x18;
      do {
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)
                   ((long)&AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar22));
        lVar22 = lVar22 + -0x18;
      } while (lVar22 != -0x18);
      lVar22 = 0x18;
      do {
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)
                   ((long)&AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar22));
        lVar22 = lVar22 + -0x18;
      } while (lVar22 != -0x18);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&electronstream.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      pRVar6 = RandomGen::rndm();
      dVar33 = this->fdetector->s2Fano * dVar34 * dVar25;
      if (dVar33 < 0.0) {
        dVar33 = sqrt(dVar33);
      }
      else {
        dVar33 = SQRT(dVar33);
      }
      dVar34 = RandomGen::rand_gauss(pRVar6,dVar34 * dVar25,dVar33,true);
      dVar34 = floor(dVar34 + 0.5);
      uVar14 = (long)(dVar34 - 9.223372036854776e+18) & (long)dVar34 >> 0x3f | (long)dVar34;
      pRVar6 = RandomGen::rndm();
      local_258 = uVar14;
      iVar7 = RandomGen::binom_draw(pRVar6,uVar14,local_118 * this->fdetector->g1_gas);
      pRVar6 = RandomGen::rndm();
      iVar8 = RandomGen::binom_draw(pRVar6,iVar7,this->fdetector->P_dphe);
      lVar22 = iVar8 + iVar7;
      local_260 = iVar7;
      pRVar6 = RandomGen::rndm();
      dVar33 = RandomGen::FindNewMean(pRVar6,this->fdetector->sPEres);
      pRVar6 = RandomGen::rndm();
      auVar36._8_4_ = (int)((ulong)lVar22 >> 0x20);
      auVar36._0_8_ = lVar22;
      auVar36._12_4_ = 0x45300000;
      dVar33 = ((auVar36._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) / dVar33;
      dVar34 = this->fdetector->sPEres;
      local_2a8 = lVar22;
      if (dVar33 < 0.0) {
        dVar31 = sqrt(dVar33);
      }
      else {
        dVar31 = SQRT(dVar33);
      }
      local_1e8 = RandomGen::rand_gauss(pRVar6,dVar33,dVar34 * dVar31,true);
      local_318._0_8_ = 0.0;
      local_2f8 = 0.0;
    }
    pVVar11 = this->fdetector;
    if (1.0 <= pVVar11->noiseLinear[1]) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                " !!WARNING!! S2 linear noise term is greater than or equal to 100% (i.e. 1.0) Did you mistake fraction for percent??"
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
      pVVar11 = this->fdetector;
    }
    dVar34 = pVVar11->noiseQuadratic[1];
    pRVar6 = RandomGen::rndm();
    pVVar11 = this->fdetector;
    if ((dVar34 != 0.0) || (NAN(dVar34))) {
      dVar34 = pVVar11->noiseQuadratic[1] * local_1e8 * local_1e8;
      dVar33 = pVVar11->noiseLinear[1] * local_1e8;
      dVar34 = SQRT(dVar33 * dVar33 + dVar34 * dVar34);
    }
    else {
      dVar34 = pVVar11->noiseLinear[1] * local_1e8;
    }
    dVar26 = RandomGen::rand_gauss(pRVar6,local_1e8,dVar34,true);
    dVar26 = dVar26 - ((double)local_318._0_8_ + local_2f8);
    dVar27 = exp(-dt_local / this->fdetector->eLife_us);
    dVar34 = this->fdetector->P_dphe;
    pRVar6 = RandomGen::rndm();
    (*this->fdetector->_vptr_VDetector[7])
              (local_2c0,local_2b8,SUB84(local_268,0),&photon_emission_times);
    dVar33 = photon_emission_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    (*this->fdetector->_vptr_VDetector[7])(local_2c0,local_2b8,SUB84(local_268,0),AreaTableBot);
    dVar31 = AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    (*this->fdetector->_vptr_VDetector[7])(local_2c0,local_2b8,SUB84(local_268,0),AreaTableTop);
    dVar31 = (1.0 - AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[1]) * dVar31 * dVar26;
    if (dVar31 < 0.0) {
      dVar31 = sqrt(dVar31);
    }
    else {
      dVar31 = SQRT(dVar31);
    }
    dVar33 = RandomGen::rand_gauss(pRVar6,dVar33 * dVar26,dVar31,true);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&AreaTableTop[0].super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&AreaTableBot[0].super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&photon_emission_times.super__Vector_base<double,_std::allocator<double>_>);
    dVar31 = exp(-dt_local / this->fdetector->eLife_us);
    pdVar23 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    *pdVar23 = dVar25;
    auVar40._8_4_ = (int)(local_258 >> 0x20);
    auVar40._0_8_ = local_258;
    auVar40._12_4_ = 0x45300000;
    pdVar23[1] = (auVar40._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_258) - 4503599627370496.0);
    auVar41._8_4_ = (int)((ulong)local_260 >> 0x20);
    auVar41._0_8_ = local_260;
    auVar41._12_4_ = 0x45300000;
    pdVar23[2] = (auVar41._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_260) - 4503599627370496.0);
    auVar42._8_4_ = (int)((ulong)local_2a8 >> 0x20);
    auVar42._0_8_ = local_2a8;
    auVar42._12_4_ = 0x45300000;
    pdVar23[3] = (auVar42._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2a8) - 4503599627370496.0);
    pVVar11 = this->fdetector;
    if (0.0 <= pVVar11->s2_thr) {
      auVar43._0_8_ = dVar26 / dVar27;
      dVar34 = dVar34 + 1.0;
      auVar43._8_8_ = dVar26;
      auVar37._8_8_ = dVar34;
      auVar37._0_8_ = local_128;
      auVar35 = divpd(auVar43,auVar37);
      pdVar23[4] = dVar26;
      *(undefined1 (*) [16])(pdVar23 + 5) = auVar35;
      local_128 = auVar35._0_8_ / dVar34;
    }
    else {
      local_128 = (dVar33 / dVar31) / local_128;
      pdVar23[4] = dVar33;
      pdVar23[5] = local_128;
      pdVar23[6] = dVar33 / (pVVar11->P_dphe + 1.0);
      local_128 = local_128 / (pVVar11->P_dphe + 1.0);
    }
    pdVar23[7] = local_128;
    if (dVar26 < ABS(pVVar11->s2_thr)) {
      for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
        bVar4 = ValidityTests::nearlyEqual(pdVar23[lVar22],0.0,1e-09);
        pdVar23 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (bVar4) {
          pdVar23[lVar22] = 1e-06;
          dVar34 = 1e-06;
        }
        else {
          dVar34 = pdVar23[lVar22];
        }
        pdVar23[lVar22] = (double)((ulong)dVar34 | (ulong)DAT_00116a10);
      }
    }
    pdVar23[8] = dVar3;
  }
  return &this->ionization;
}

Assistant:

const vector<double> &NESTcalc::GetS2(
    int Ne, double truthPosX, double truthPosY, double truthPosZ,
    double smearPosX, double smearPosY, double smearPosZ, double dt,
    double driftVelocity, uint64_t evtNum, double dfield,
    S2CalculationMode mode, int outputTiming, vector<int64_t> &wf_time,
    vector<double> &wf_amp, const vector<double> &g2_params) {
  double elYield = g2_params[0];
  double ExtEff = g2_params[1];
  double SE = g2_params[2];
  double g2 = g2_params[3];
  double gasGap = g2_params[4];

  std::fill(ionization.begin(), ionization.end(), 0);

  double subtract[2] = {0., 0.};
  int i;
  bool eTrain = false;
  if (mode == S2CalculationMode::WaveformWithEtrain &&
      !fdetector->get_inGas()) {
    eTrain = true;
  }

  if (dfield < FIELD_MIN  //"zero"-drift-field detector has no S2
      || elYield <= 0. || ExtEff <= 0. || SE <= 0. || g2 <= 0. ||
      gasGap <= 0.) {
    return ionization;
  }

  // Add some variability in g1_gas drawn from a polynomial spline fit
  double posDep =
      fdetector->FitS2(truthPosX, truthPosY,
                       VDetector::fold);  // XY is always in mm now, never cm
  double posDepSm;
  if (XYcorr == 2 || XYcorr == 3) {
    posDepSm = fdetector->FitS2(smearPosX, smearPosY, VDetector::unfold);
  } else {
    posDepSm = fdetector->FitS2(0, 0, VDetector::unfold);
  }
  posDep /= fdetector->FitS2(0., 0., VDetector::fold);
  posDepSm /= fdetector->FitS2(0., 0., VDetector::unfold);
  double dz = fdetector->get_TopDrift() - dt * driftVelocity;

  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 1.)) {
    posDep = 1.;
    posDepSm = 1.;
  }
  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 0.)) {
    posDep = 0.;
    posDepSm = 0.;
  }

  int Nee = RandomGen::rndm()->binom_draw(
      Ne, ExtEff * exp(-dt / fdetector->get_eLife_us()));
  // MAKE this 1 for SINGLE e- DEBUG

  uint64_t Nph = 0, nHits = 0, Nphe = 0;
  double pulseArea = 0.;

  if (mode == S2CalculationMode::Waveform ||
      mode == S2CalculationMode::WaveformWithEtrain) {
    uint64_t k;
    int stopPoint;
    double tau1, tau2, E_liq, amp2;
    vector<double> electronstream, AreaTableBot[2], AreaTableTop[2], TimeTable;
    if (eTrain) {
      stopPoint = RandomGen::rndm()->binom_draw(
          Ne, exp(-dt / fdetector->get_eLife_us()));
    } else {
      stopPoint = Nee;
    }
    electronstream.resize(stopPoint, dt);
    double elecTravT = 0., DL, DL_time, DT, phi, sigX, sigY, newX, newY;
    double Diff_Tran =
      GetDiffTran_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);
    double Diff_Long =
      GetDiffLong_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);

    // a good rule of thumb but only for liquids, as gas kind of opposite:
    // Diff_Long ~ 0.15 * Diff_Tran, as it is in LAr, at least as field goes to
    // infinity
    double Diff_Long_Gas =
        4.265 + 19097. / (1e3 * fdetector->get_E_gas()) -
        1.7397e6 / pow(1e3 * fdetector->get_E_gas(), 2.) +
        1.2477e8 / pow(1e3 * fdetector->get_E_gas(), 3.);  // Nygren, NEXT
    double Diff_Tran_Gas = Diff_Tran * 0.01;
    if (fdetector->get_inGas()) {
      Diff_Tran *= 0.01;
      Diff_Long = 4.265 + 19097. / dfield - 1.7397e6 / pow(dfield, 2.) +
                  1.2477e8 / pow(dfield, 3.);
    }
    double sigmaDL =
        10. * sqrt(2. * Diff_Long * dt *
                   1e-6);  // sqrt of cm^2/s * s = cm; times 10 for mm.
    double sigmaDT = 10. * sqrt(2. * Diff_Tran * dt * 1e-6);
    bool YesGas = true;
    double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                            YesGas, 1, fdetector->get_molarMass());
    double driftVelocity_gas =
      GetDriftVelocity_MagBoltz(fdetector->get_T_Kelvin(), rho, fdetector->get_E_gas() * 1000., fdetector->get_p_bar(), fdetector->get_molarMass());
    double dt_gas = gasGap / driftVelocity_gas;
    double sigmaDLg = 10. * sqrt(2. * Diff_Long_Gas * dt_gas * 1e-6);
    double sigmaDTg = 10. * sqrt(2. * Diff_Tran_Gas * dt_gas * 1e-6);
    double tauTrap = 0.28326 + 5303/(dfield*dfield);  // microseconds, to match
    // LZ SR3, LUX Run03, Xe100/10. 0.185 (fixed) based on 1310.1117 (Gaussian)
    double min = 1e100;
    for (i = 0; i < stopPoint; ++i) {
      elecTravT = 0.;  // resetting for the current electron
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDL, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDT, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX = truthPosX + sigX;
      newY = truthPosY + sigY;
      if (newX * newX + newY * newY >
          fdetector->get_radmax() * fdetector->get_radmax()) {
        continue;  // remove electrons from outside the maximum possible radius
                   // (alternative is squeeze them, depending on your E-fields)
      }
      DL_time = DL / driftVelocity;
      elecTravT += DL_time;
      if (!fdetector->get_inGas() && fdetector->get_E_gas() != 0.) {
        elecTravT -= tauTrap * log(RandomGen::rndm()->rand_uniform());
      }
      electronstream[i] += elecTravT;
      SE = floor(RandomGen::rndm()->rand_gauss(
                     elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                 0.5);
      Nph += uint64_t(SE);
      SE = (double)RandomGen::rndm()->binom_draw(
          uint64_t(SE), fdetector->get_g1_gas() * posDep);
      nHits += uint64_t(SE);
      double KE = 0.5 * 9.109e-31 * driftVelocity_gas * driftVelocity_gas *
                  1e6 / 1.602e-16;
      double origin = fdetector->get_TopDrift() + gasGap / 2.;
      QuantaResult quanta{};
      quanta.photons = int(SE);
      quanta.electrons = 0;
      quanta.ions = 0;
      quanta.excitons = int(floor(0.0566 * SE + 0.5));
      photonstream photon_emission_times = GetPhotonTimes(
          NEST::beta, quanta.photons, quanta.excitons, dfield, KE);
      photonstream photon_times =
          AddPhotonTransportTime(photon_emission_times, newX, newY, origin);
      SE += (double)RandomGen::rndm()->binom_draw(uint64_t(SE),
                                                  fdetector->get_P_dphe());
      Nphe += uint64_t(SE);
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDLg, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDTg, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX += sigX;
      newY += sigY;
      DL_time = DL / driftVelocity_gas;
      electronstream[i] += DL_time;
      if (i >= Nee && eTrain) {  // exponential based on arXiv:1711.07025, power
                                 // on 2004.07791
        E_liq = fdetector->get_E_gas() / (EPS_LIQ / std::abs(EPS_GAS));
        tau2 = (fdetector->get_TopDrift() /
                driftVelocity);  // 0.58313 * exp(0.20929 * E_liq) * 1e3;
        tau1 = 1.40540 * exp(0.15578 * E_liq) * 1e3 * 1e-2;
        amp2 = 0.38157 * exp(0.21177 * E_liq) * 1e-2;
        if (RandomGen::rndm()->rand_uniform() < (amp2 / 0.035) * ExtEff) {
          tau2 /= RandomGen::rndm()->rand_uniform();
          if (tau2 > 1e6) tau2 = 1e6;  // 1 sec. cap
          electronstream[i] += tau2;
        } else {
          electronstream[i] -= tau1 * log(RandomGen::rndm()->rand_uniform());
        }
      }
      for (double j = 0.; j < SE; j += 1.) {
        double phe = RandomGen::rndm()->rand_zero_trunc_gauss(
            1. / RandomGen::rndm()->FindNewMean(fdetector->get_sPEres()),
            fdetector->get_sPEres());
        if (i < Nee || !eTrain) pulseArea += phe;
        origin = fdetector->get_TopDrift() +
                 gasGap * RandomGen::rndm()->rand_uniform();
        k = uint64_t(j);
        if (k >= photon_times.size()) k -= photon_times.size();
        double offset = ((fdetector->get_anode() - origin) / driftVelocity_gas +
                         electronstream[i]) *
                            1e3 +
                        photon_times[k];
        if (offset < min) min = offset;
        if (RandomGen::rndm()->rand_uniform() <
            fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1]) {
          AreaTableBot[0].emplace_back(phe);
          AreaTableTop[0].emplace_back(0.0);
        } else {
          AreaTableBot[0].emplace_back(0.0);
          AreaTableTop[0].emplace_back(phe);
        }
        TimeTable.emplace_back(offset);
      }
    }
    int numPts = Nphe * 1000;
    if (numPts < 1000 / SAMPLE_SIZE) numPts = 1000 / SAMPLE_SIZE;
    AreaTableBot[1].resize(numPts, 0.);
    AreaTableTop[1].resize(numPts, 0.);
    min -= 5. * SAMPLE_SIZE;
    for (k = 0; k < Nphe; ++k) {
      vector<double> PEperBin;
      if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableTop[0][k], TimeTable[k] - min);
      else {
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableBot[0][k], TimeTable[k] - min);
      }
      for (i = 0; i < int(PEperBin.size()) - 1; ++i) {
        double eTime = PEperBin[0] + i * SAMPLE_SIZE;
        int index = int(floor(eTime / SAMPLE_SIZE + 0.5));
        index = NESTcalc::clamp(index, 0, numPts - 1);
        if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
          AreaTableTop[1][index] += 10. * AreaTableTop[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        else {
          AreaTableBot[1][index] += 10. * AreaTableBot[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        }
      }
    }
    for (k = 0; k < numPts; ++k) {
      if ((AreaTableBot[1][k] + AreaTableTop[1][k]) <= PULSEHEIGHT) continue;
      wf_time.emplace_back(k * SAMPLE_SIZE + int64_t(min + SAMPLE_SIZE / 2.));
      wf_amp.emplace_back(AreaTableBot[1][k] + AreaTableTop[1][k]);

      if (outputTiming >= 0) {
        char line[80];
        if (AreaTableBot[1][k] > PHE_MAX)
          subtract[0] = AreaTableBot[1][k] - PHE_MAX;
        else {
          subtract[0] = 0.0;
        }
        if (AreaTableTop[1][k] > PHE_MAX)
          subtract[1] = AreaTableTop[1][k] - PHE_MAX;
        else {
          subtract[1] = 0.0;
        }
        snprintf(line, 80, "%llu\t%lld\t%.3f\t%.3f",
                 (long long unsigned int)evtNum, (long long int)wf_time.back(),
                 AreaTableBot[1][k] - subtract[0],
                 AreaTableTop[1][k] - subtract[1]);
        pulseFile << line << endl;
      }
    }
  } else {
    Nph = uint64_t(
        floor(RandomGen::rndm()->rand_gauss(
                  elYield * double(Nee),
                  sqrt(fdetector->get_s2Fano() * elYield * double(Nee)), true) +
              0.5));
    nHits =
        RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
    Nphe =
        nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
    double NewMean = RandomGen::rndm()->FindNewMean(fdetector->get_sPEres());
    pulseArea = RandomGen::rndm()->rand_gauss(
        Nphe / NewMean, fdetector->get_sPEres() * sqrt(Nphe / NewMean), true);
  }

  if (fdetector->get_noiseLinear()[1] >= 1.0)
    cerr << " !!WARNING!! S2 linear noise term is greater than or equal to 100% "
            "(i.e. 1.0) Did you mistake fraction for percent??"
         << endl;
  if (fdetector->get_noiseQuadratic()[1] != 0) {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea,
        sqrt(pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
             pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
        true);
  } else {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
  }
  pulseArea -= (subtract[0] + subtract[1]);
  double pulseAreaC =
      pulseArea / exp(-dt / fdetector->get_eLife_us()) / posDepSm;
  double Nphd = pulseArea / (1. + fdetector->get_P_dphe());
  double NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());

  double S2b = RandomGen::rndm()->rand_gauss(
      fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea,
      sqrt(fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea *
           (1. - fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1])),
      true);
  double S2bc =
      S2b / exp(-dt / fdetector->get_eLife_us()) /
      posDepSm;  // for detectors using S2 bottom-only in their analyses

  ionization[0] = Nee;  // integer number of electrons unabsorbed in liquid then
  // getting extracted
  ionization[1] = Nph;    // raw number of photons produced in the gas gap
  ionization[2] = nHits;  // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  ionization[3] = Nphe;  // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  if (fdetector->get_s2_thr() >= 0) {
    ionization[4] = pulseArea;  // floating real# smeared DAQ pulse areas in
    // phe, NO XYZ correction
    ionization[5] =
        pulseAreaC;  // smeared DAQ pulse areas in phe, WITH XYZ correction
    ionization[6] = Nphd;  // same as pulse area, adjusted/corrected *downward*
    // for 2-PE effect (LUX phd units)
    ionization[7] = NphdC;  // same as Nphd, but XYZ-corrected
  }
  // Negative S2 threshold is a hidden feature, which switches from S2 -> S2
  // bottom (NOT literally negative)
  else {
    ionization[4] = S2b;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, NO XYZ correction
    ionization[5] = S2bc;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, WITH XYZ correction
    ionization[6] =
        S2b / (1. + fdetector->get_P_dphe());  // same as S2b, but adjusted for
    // 2-PE effect (LUX phd units)
    ionization[7] = S2bc / (1. + fdetector->get_P_dphe());  // same as S2bc, but
                                                            // adjusted for 2-PE
                                                            // effect (LUX phd
                                                            // units)
  }

  if (pulseArea < std::abs(fdetector->get_s2_thr())) {
    for (i = 0; i < 8; ++i) {
      if (ValidityTests::nearlyEqual(ionization[i], 0.))
        ionization[i] = PHE_MIN;
      ionization[i] = -1. * std::abs(ionization[i]);
    }
  }

  ionization[8] =
      g2;  // g2 = ExtEff * SE, gain of EL in gas gap (from CalculateG2)

  return ionization;
}